

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_constant.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformConstant(Transformer *this,PGAConst *c)

{
  type expr;
  long in_RDX;
  PGValue val;
  optional_ptr<duckdb::Transformer,_true> local_20;
  
  val.val.ival._0_4_ = *(undefined4 *)(in_RDX + 8);
  val._0_8_ = c;
  val.val.ival._4_4_ = 0;
  TransformValue((Transformer *)&stack0xffffffffffffffe0,val);
  expr = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
         ::operator*((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                      *)&stack0xffffffffffffffe0);
  SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x18));
  (this->parent).ptr = local_20.ptr;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformConstant(duckdb_libpgquery::PGAConst &c) {
	auto constant = TransformValue(c.val);
	SetQueryLocation(*constant, c.location);
	return std::move(constant);
}